

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

int Cudd_IsInHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  DdHook *pDVar1;
  int iVar2;
  DdHook **ppDVar3;
  
  iVar2 = 0;
  if (where < 4) {
    ppDVar3 = &dd->preGCHook + where;
    do {
      pDVar1 = *ppDVar3;
      if (pDVar1 == (DdHook *)0x0) {
        return 0;
      }
      ppDVar3 = &pDVar1->next;
    } while (pDVar1->f != f);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
Cudd_IsInHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook *hook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = dd->preGCHook;
        break;
    case CUDD_POST_GC_HOOK:
        hook = dd->postGCHook;
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = dd->preReorderingHook;
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = dd->postReorderingHook;
        break;
    default:
        return(0);
    }
    /* Scan the list and find whether the function is already there. */
    while (hook != NULL) {
        if (hook->f == f) {
            return(1);
        }
        hook = hook->next;
    }
    return(0);

}